

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O2

void __thiscall CholeskyFactor::solveL(CholeskyFactor *this,QpVector *rhs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  
  if (this->uptodate == false) {
    recompute(this);
  }
  uVar1 = this->current_k;
  if (uVar1 == rhs->dim) {
    iVar2 = this->current_k_max;
    pdVar4 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (rhs->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = uVar8;
    }
    for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
      pdVar6 = (rhs->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = this->current_k_max;
      pdVar10 = (double *)
                ((long)(this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar8);
      for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
        pdVar6[uVar9] = pdVar6[uVar9] - pdVar6[uVar11] * *pdVar10;
        pdVar10 = pdVar10 + iVar3;
      }
      pdVar5[uVar9] = pdVar5[uVar9] / pdVar4[(iVar2 + 1) * (int)uVar9];
      uVar8 = uVar8 + 8;
    }
    return;
  }
  puts("dimension mismatch");
  return;
}

Assistant:

void solveL(QpVector& rhs) {
    if (!uptodate) {
      recompute();
    }

    if (current_k != rhs.dim) {
      printf("dimension mismatch\n");
      return;
    }

    for (HighsInt r = 0; r < rhs.dim; r++) {
      for (HighsInt j = 0; j < r; j++) {
        rhs.value[r] -= rhs.value[j] * L[j * current_k_max + r];
      }

      rhs.value[r] /= L[r * current_k_max + r];
    }
  }